

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

CommandStatusKind anon_unknown.dwarf_60e82::convertStatusKind(StatusKind kind)

{
  CommandStatusKind local_c;
  StatusKind kind_local;
  
  if (kind == IsScanning) {
    local_c = IsScanning;
  }
  else if (kind == IsUpToDate) {
    local_c = IsUpToDate;
  }
  else {
    if (kind != IsComplete) {
      __assert_fail("0 && \"unknown status kind\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp"
                    ,0x675,
                    "BuildSystemDelegate::CommandStatusKind (anonymous namespace)::convertStatusKind(core::Rule::StatusKind)"
                   );
    }
    local_c = IsComplete;
  }
  return local_c;
}

Assistant:

static BuildSystemDelegate::CommandStatusKind
convertStatusKind(core::Rule::StatusKind kind) {
  switch (kind) {
  case core::Rule::StatusKind::IsScanning:
    return BuildSystemDelegate::CommandStatusKind::IsScanning;
  case core::Rule::StatusKind::IsUpToDate:
    return BuildSystemDelegate::CommandStatusKind::IsUpToDate;
  case core::Rule::StatusKind::IsComplete:
    return BuildSystemDelegate::CommandStatusKind::IsComplete;
  }
  assert(0 && "unknown status kind");
  return BuildSystemDelegate::CommandStatusKind::IsScanning;
}